

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArguments.cxx
# Opt level: O3

int __thiscall cmsys::CommandLineArguments::Parse(CommandLineArguments *this)

{
  pointer pcVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  mapped_type *cs;
  ulong uVar6;
  Internal *pIVar7;
  ostream *poVar8;
  undefined8 uVar9;
  size_type *psVar10;
  long lVar11;
  pointer pbVar12;
  ulong uVar13;
  long lVar14;
  pointer pSVar15;
  string *psVar16;
  ulong uVar17;
  long lVar18;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  matches;
  long *local_68 [2];
  long local_58 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (this->StoreUnusedArgumentsFlag == true) {
    std::vector<cmsys::String,_std::allocator<cmsys::String>_>::_M_erase_at_end
              (&(this->Internals->UnusedArguments).
                super_vector<cmsys::String,_std::allocator<cmsys::String>_>,
               (this->Internals->UnusedArguments).
               super_vector<cmsys::String,_std::allocator<cmsys::String>_>.
               super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>._M_impl.
               super__Vector_impl_data._M_start);
  }
  pIVar7 = this->Internals;
  pSVar15 = (pIVar7->Argv).super_vector<cmsys::String,_std::allocator<cmsys::String>_>.
            super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>._M_impl.
            super__Vector_impl_data._M_start;
  iVar3 = 1;
  if ((pIVar7->Argv).super_vector<cmsys::String,_std::allocator<cmsys::String>_>.
      super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>._M_impl.
      super__Vector_impl_data._M_finish != pSVar15) {
    uVar17 = 0;
LAB_001202fe:
    lVar18 = uVar17 * 0x20;
    psVar16 = &pSVar15[uVar17].super_string;
    pIVar7->LastArgument = uVar17;
    bVar2 = GetMatchedArguments(this,&local_48,psVar16);
    if (!bVar2) {
      pIVar7 = this->Internals;
      if (pIVar7->UnknownArgumentCallback == (ErrorCallbackType)0x0) {
        if (this->StoreUnusedArgumentsFlag == true) {
          std::__cxx11::string::string((string *)local_68,(string *)psVar16,0,0xffffffffffffffff);
          std::vector<cmsys::String,_std::allocator<cmsys::String>_>::emplace_back<cmsys::String>
                    (&(pIVar7->UnusedArguments).
                      super_vector<cmsys::String,_std::allocator<cmsys::String>_>,(String *)local_68
                    );
          if (local_68[0] != local_58) {
            operator_delete(local_68[0],local_58[0] + 1);
          }
          goto LAB_00120571;
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Got unknown argument: \"",0x17);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,(psVar16->_M_dataplus)._M_p,
                            psVar16->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\"",1);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
        std::ostream::put((char)poVar8);
        std::ostream::flush();
      }
      else {
        iVar4 = (*pIVar7->UnknownArgumentCallback)((psVar16->_M_dataplus)._M_p,pIVar7->ClientData);
        iVar3 = 1;
        if (iVar4 != 0) goto LAB_00120652;
      }
LAB_00120649:
      pIVar7 = this->Internals;
      goto LAB_0012064c;
    }
    if ((long)local_48.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_48.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start == 0) {
      lVar11 = 0;
    }
    else {
      lVar5 = (long)local_48.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_48.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5;
      psVar10 = &(local_48.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->_M_string_length;
      uVar6 = 0;
      lVar11 = 0;
      lVar14 = 0;
      do {
        if (uVar6 < *psVar10) {
          uVar6 = *psVar10;
          lVar11 = lVar14;
        }
        lVar14 = lVar14 + 1;
        psVar10 = psVar10 + 4;
      } while (lVar5 + (ulong)(lVar5 == 0) != lVar14);
    }
    pIVar7 = this->Internals;
    std::__cxx11::string::string
              ((string *)local_68,
               (string *)
               (local_48.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + lVar11),0,0xffffffffffffffff);
    cs = std::
         map<cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>_>_>
         ::operator[](&(pIVar7->Callbacks).
                       super_map<cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>_>_>
                      ,(key_type *)local_68);
    if (local_68[0] != local_58) {
      operator_delete(local_68[0],local_58[0] + 1);
    }
    pbVar12 = local_48.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + lVar11;
    iVar3 = std::__cxx11::string::compare((char *)pbVar12);
    if (iVar3 != 0) {
      abort();
    }
    switch(cs->ArgumentType) {
    case 0:
      bVar2 = PopulateVariable(this,cs,(char *)0x0);
      goto LAB_00120569;
    case 1:
      bVar2 = PopulateVariable(this,cs,(psVar16->_M_dataplus)._M_p + pbVar12->_M_string_length);
LAB_00120569:
      if (bVar2 == false) goto LAB_00120650;
LAB_00120571:
      uVar17 = uVar17 + 1;
      pIVar7 = this->Internals;
      pSVar15 = (pIVar7->Argv).super_vector<cmsys::String,_std::allocator<cmsys::String>_>.
                super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>._M_impl.
                super__Vector_impl_data._M_start;
      if ((ulong)((long)(pIVar7->Argv).super_vector<cmsys::String,_std::allocator<cmsys::String>_>.
                        super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)pSVar15 >> 5) <= uVar17)
      goto LAB_001205b5;
      goto LAB_001202fe;
    case 2:
      pIVar7 = this->Internals;
      lVar18 = (long)(pIVar7->Argv).super_vector<cmsys::String,_std::allocator<cmsys::String>_>.
                     super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>._M_impl.
                     super__Vector_impl_data._M_start;
      if (uVar17 != ((long)(pIVar7->Argv).
                           super_vector<cmsys::String,_std::allocator<cmsys::String>_>.
                           super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>._M_impl
                           .super__Vector_impl_data._M_finish - lVar18 >> 5) - 1U) {
        uVar17 = uVar17 + 1;
        bVar2 = PopulateVariable(this,cs,*(char **)(lVar18 + uVar17 * 0x20));
        goto LAB_00120569;
      }
      break;
    case 3:
      uVar6 = pbVar12->_M_string_length;
      if (psVar16->_M_string_length != uVar6) {
        if (psVar16->_M_string_length <= uVar6) {
          uVar9 = std::__throw_out_of_range_fmt
                            ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)");
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_48);
          _Unwind_Resume(uVar9);
        }
        pcVar1 = (psVar16->_M_dataplus)._M_p;
        if (pcVar1[uVar6] == '=') {
          bVar2 = PopulateVariable(this,cs,pcVar1 + uVar6 + 1);
          goto LAB_00120569;
        }
      }
      goto LAB_00120649;
    case 4:
      while( true ) {
        uVar13 = uVar17 + 1;
        lVar18 = lVar18 + 0x20;
        lVar11 = (long)(this->Internals->Argv).
                       super_vector<cmsys::String,_std::allocator<cmsys::String>_>.
                       super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>._M_impl.
                       super__Vector_impl_data._M_start;
        uVar6 = (long)(this->Internals->Argv).
                      super_vector<cmsys::String,_std::allocator<cmsys::String>_>.
                      super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>._M_impl.
                      super__Vector_impl_data._M_finish - lVar11 >> 5;
        if (uVar6 <= uVar13) break;
        psVar16 = (string *)(lVar11 + lVar18);
        bVar2 = GetMatchedArguments(this,&local_48,psVar16);
        if (bVar2) {
          uVar6 = (long)(this->Internals->Argv).
                        super_vector<cmsys::String,_std::allocator<cmsys::String>_>.
                        super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)(this->Internals->Argv).
                        super_vector<cmsys::String,_std::allocator<cmsys::String>_>.
                        super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>._M_impl.
                        super__Vector_impl_data._M_start >> 5;
          break;
        }
        bVar2 = PopulateVariable(this,cs,(psVar16->_M_dataplus)._M_p);
        uVar17 = uVar13;
        if (!bVar2) goto LAB_00120650;
      }
      if (uVar6 == uVar13) {
        uVar17 = uVar13;
      }
      goto LAB_00120571;
    default:
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Got unknown argument type: \"",0x1c);
      poVar8 = (ostream *)std::ostream::operator<<(&std::cerr,cs->ArgumentType);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\"",1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
      std::ostream::put((char)poVar8);
      std::ostream::flush();
      pIVar7 = this->Internals;
    }
LAB_0012064c:
    pIVar7->LastArgument = pIVar7->LastArgument - 1;
LAB_00120650:
    iVar3 = 0;
  }
LAB_00120652:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  return iVar3;
LAB_001205b5:
  iVar3 = 1;
  goto LAB_00120652;
}

Assistant:

int CommandLineArguments::Parse()
{
  std::vector<std::string>::size_type cc;
  std::vector<std::string> matches;
  if (this->StoreUnusedArgumentsFlag) {
    this->Internals->UnusedArguments.clear();
  }
  for (cc = 0; cc < this->Internals->Argv.size(); cc++) {
    const std::string& arg = this->Internals->Argv[cc];
    CommandLineArguments_DEBUG("Process argument: " << arg);
    this->Internals->LastArgument = cc;
    if (this->GetMatchedArguments(&matches, arg)) {
      // Ok, we found one or more arguments that match what user specified.
      // Let's find the longest one.
      CommandLineArguments::Internal::VectorOfStrings::size_type kk;
      CommandLineArguments::Internal::VectorOfStrings::size_type maxidx = 0;
      CommandLineArguments::Internal::String::size_type maxlen = 0;
      for (kk = 0; kk < matches.size(); kk++) {
        if (matches[kk].size() > maxlen) {
          maxlen = matches[kk].size();
          maxidx = kk;
        }
      }
      // So, the longest one is probably the right one. Now see if it has any
      // additional value
      CommandLineArgumentsCallbackStructure* cs =
        &this->Internals->Callbacks[matches[maxidx]];
      const std::string& sarg = matches[maxidx];
      if (cs->Argument != sarg) {
        abort();
      }
      switch (cs->ArgumentType) {
        case NO_ARGUMENT:
          // No value
          if (!this->PopulateVariable(cs, nullptr)) {
            return 0;
          }
          break;
        case SPACE_ARGUMENT:
          if (cc == this->Internals->Argv.size() - 1) {
            this->Internals->LastArgument--;
            return 0;
          }
          CommandLineArguments_DEBUG("This is a space argument: "
                                     << arg << " value: "
                                     << this->Internals->Argv[cc + 1]);
          // Value is the next argument
          if (!this->PopulateVariable(cs,
                                      this->Internals->Argv[cc + 1].c_str())) {
            return 0;
          }
          cc++;
          break;
        case EQUAL_ARGUMENT:
          if (arg.size() == sarg.size() || arg.at(sarg.size()) != '=') {
            this->Internals->LastArgument--;
            return 0;
          }
          // Value is everythng followed the '=' sign
          if (!this->PopulateVariable(cs, arg.c_str() + sarg.size() + 1)) {
            return 0;
          }
          break;
        case CONCAT_ARGUMENT:
          // Value is whatever follows the argument
          if (!this->PopulateVariable(cs, arg.c_str() + sarg.size())) {
            return 0;
          }
          break;
        case MULTI_ARGUMENT:
          // Suck in all the rest of the arguments
          CommandLineArguments_DEBUG("This is a multi argument: " << arg);
          for (cc++; cc < this->Internals->Argv.size(); ++cc) {
            const std::string& marg = this->Internals->Argv[cc];
            CommandLineArguments_DEBUG(
              " check multi argument value: " << marg);
            if (this->GetMatchedArguments(&matches, marg)) {
              CommandLineArguments_DEBUG("End of multi argument "
                                         << arg << " with value: " << marg);
              break;
            }
            CommandLineArguments_DEBUG(
              " populate multi argument value: " << marg);
            if (!this->PopulateVariable(cs, marg.c_str())) {
              return 0;
            }
          }
          if (cc != this->Internals->Argv.size()) {
            CommandLineArguments_DEBUG("Again End of multi argument " << arg);
            cc--;
            continue;
          }
          break;
        default:
          std::cerr << "Got unknown argument type: \"" << cs->ArgumentType
                    << "\"" << std::endl;
          this->Internals->LastArgument--;
          return 0;
      }
    } else {
      // Handle unknown arguments
      if (this->Internals->UnknownArgumentCallback) {
        if (!this->Internals->UnknownArgumentCallback(
              arg.c_str(), this->Internals->ClientData)) {
          this->Internals->LastArgument--;
          return 0;
        }
        return 1;
      } else if (this->StoreUnusedArgumentsFlag) {
        CommandLineArguments_DEBUG("Store unused argument " << arg);
        this->Internals->UnusedArguments.push_back(arg);
      } else {
        std::cerr << "Got unknown argument: \"" << arg << "\"" << std::endl;
        this->Internals->LastArgument--;
        return 0;
      }
    }
  }
  return 1;
}